

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O0

SOCKET SimpleServer::makeListener(int port,bool blocking)

{
  int iVar1;
  undefined1 local_2c [4];
  int error;
  sockaddr_in listAddr;
  int iSetOption;
  int listSocket;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  bool blocking_local;
  int port_local;
  
  listAddr.sin_zero._4_4_ = socket(2,1,0);
  _uStack_c = listAddr.sin_zero._4_4_;
  if (-1 < (int)listAddr.sin_zero._4_4_) {
    listAddr.sin_zero[0] = '\x01';
    listAddr.sin_zero[1] = '\0';
    listAddr.sin_zero[2] = '\0';
    listAddr.sin_zero[3] = '\0';
    setsockopt(listAddr.sin_zero._4_4_,1,2,listAddr.sin_zero,4);
    memset(local_2c,0,0x10);
    local_2c._0_2_ = 2;
    error = 0;
    local_2c._2_2_ = htons((uint16_t)port);
    iVar1 = bind(listAddr.sin_zero._4_4_,(sockaddr *)local_2c,0x10);
    if (iVar1 == -1) {
      _uStack_c = -1;
    }
    else {
      listen(listAddr.sin_zero._4_4_,5);
      setBlocking(listAddr.sin_zero._4_4_,blocking);
      uStack_c = listAddr.sin_zero[4];
      uStack_b = listAddr.sin_zero[5];
      uStack_a = listAddr.sin_zero[6];
      blocking_local = (bool)listAddr.sin_zero[7];
    }
  }
  return _uStack_c;
}

Assistant:

SOCKET makeListener(int port, bool blocking = true)
	{
		auto listSocket = socket(AF_INET, SOCK_STREAM, 0);
		if (SOCKET_IS_INVALID(listSocket))
			return listSocket;

		int iSetOption = 1;
		setsockopt(listSocket, SOL_SOCKET, SO_REUSEADDR, (char*)&iSetOption, sizeof(iSetOption));

		struct sockaddr_in listAddr;
		memset(&listAddr, 0, sizeof(listAddr));

		listAddr.sin_family = AF_INET;
		listAddr.sin_addr.s_addr = INADDR_ANY;
		listAddr.sin_port = htons(port);

		auto error = bind(listSocket, (struct sockaddr *) &listAddr, sizeof(listAddr));
		if (error == SOCKET_ERROR)
			return error;

		listen(listSocket, 5);

		setBlocking(listSocket, blocking);

		return listSocket;
	}